

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasm.c
# Opt level: O1

void CheckAndSortAliases(s_assenv *ae)

{
  s_alias *psVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *__haystack;
  char *pcVar5;
  size_t sVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  char **ptr_expr;
  s_alias *psVar12;
  s_alias tmpalias;
  char *local_48;
  char *pcStack_40;
  undefined8 local_38;
  
  iVar2 = ae->ialias;
  if (1 < (long)iVar2) {
    psVar12 = ae->alias;
    ptr_expr = &psVar12[(long)iVar2 + -1].translation;
    __haystack = *ptr_expr;
    lVar9 = 0;
    do {
      pcVar5 = strstr(__haystack,*(char **)((long)&psVar12->alias + lVar9));
      if (pcVar5 != (char *)0x0) {
        ExpressionFastTranslate(ae,ptr_expr,2);
        psVar12 = ae->alias;
        iVar2 = ae->ialias;
        sVar6 = strlen(psVar12[(long)iVar2 + -1].translation);
        psVar12[(long)iVar2 + -1].len = (int)sVar6;
        break;
      }
      lVar9 = lVar9 + 0x18;
    } while ((ulong)(iVar2 - 1) * 0x18 != lVar9);
  }
  iVar2 = ae->ialias;
  lVar9 = (long)iVar2;
  uVar7 = lVar9 - 1;
  if ((int)uVar7 != 0) {
    psVar12 = ae->alias;
    iVar3 = psVar12[uVar7].crc;
    uVar10 = iVar2 * 3;
    if (iVar3 <= psVar12[lVar9 + -2].crc) {
      if (iVar3 < psVar12->crc) {
        psVar1 = psVar12 + uVar7;
        local_38._0_4_ = psVar1->crc;
        local_38._4_4_ = psVar1->len;
        local_48 = psVar1->alias;
        pcStack_40 = psVar1->translation;
        memmove(psVar12 + 1,psVar12,uVar7 * 0x18);
        psVar12 = ae->alias;
      }
      else {
        if (0 < iVar2) {
          iVar11 = 0;
          do {
            uVar10 = (uint)((int)uVar7 + iVar11) >> 1;
            iVar4 = psVar12[uVar10].crc;
            if (iVar4 == iVar3) break;
            iVar8 = uVar10 + 1;
            if (iVar3 <= iVar4) {
              iVar8 = iVar11;
            }
            if (iVar3 < iVar4) {
              iVar8 = iVar11;
            }
            uVar7 = uVar7 & 0xffffffff;
            if (iVar3 < iVar4) {
              uVar7 = (ulong)(uVar10 - 1);
            }
            iVar11 = iVar8;
          } while (iVar8 <= (int)uVar7);
        }
        uVar10 = uVar10 + (psVar12[(int)uVar10].crc < iVar3);
        local_38._0_4_ = psVar12[lVar9 + -1].crc;
        local_38._4_4_ = psVar12[lVar9 + -1].len;
        local_48 = psVar12[lVar9 + -1].alias;
        pcStack_40 = psVar12[lVar9 + -1].translation;
        memmove(psVar12 + (long)(int)uVar10 + 1,psVar12 + (int)uVar10,
                (long)(int)(~uVar10 + iVar2) * 0x18);
        psVar12 = ae->alias + (int)uVar10;
      }
      psVar12->crc = (undefined4)local_38;
      psVar12->len = local_38._4_4_;
      psVar12->alias = local_48;
      psVar12->translation = pcStack_40;
    }
  }
  return;
}

Assistant:

void CheckAndSortAliases(struct s_assenv *ae)
{
	#undef FUNC
	#define FUNC "CheckAndSortAliases"

	struct s_alias tmpalias;
	int i,dw,dm,du,crc;
	for (i=0;i<ae->ialias-1;i++) {
		/* is there previous aliases in the new alias? */
		if (strstr(ae->alias[ae->ialias-1].translation,ae->alias[i].alias)) {
			/* there is a match, apply alias translation */
			ExpressionFastTranslate(ae,&ae->alias[ae->ialias-1].translation,2);
			/* need to compute again len */
			ae->alias[ae->ialias-1].len=strlen(ae->alias[ae->ialias-1].translation);
			break;
		}
	}
	
	/* cas particuliers pour insertion en d�but ou fin de liste */
	if (ae->ialias-1) {
		if (ae->alias[ae->ialias-1].crc>ae->alias[ae->ialias-2].crc) {
			/* pas de tri il est d�j� au bon endroit */
		} else if (ae->alias[ae->ialias-1].crc<ae->alias[0].crc) {
			/* insertion tout en bas de liste */
			tmpalias=ae->alias[ae->ialias-1];
			MemMove(&ae->alias[1],&ae->alias[0],sizeof(struct s_alias)*(ae->ialias-1));
			ae->alias[0]=tmpalias;
		} else {
			/* on cherche ou inserer */
			crc=ae->alias[ae->ialias-1].crc;
			dw=0;
			du=ae->ialias-1;
			while (dw<=du) {
				dm=(dw+du)/2;
				if (ae->alias[dm].crc==crc) {
					break;
				} else if (ae->alias[dm].crc>crc) {
					du=dm-1;
				} else if (ae->alias[dm].crc<crc) {
					dw=dm+1;
				}
			}
			/* ajustement */
			if (ae->alias[dm].crc<crc) dm++;
			/* insertion */
			tmpalias=ae->alias[ae->ialias-1];
			MemMove(&ae->alias[dm+1],&ae->alias[dm],sizeof(struct s_alias)*(ae->ialias-1-dm));
			ae->alias[dm]=tmpalias;
		}
	} else {
		/* one alias need no sort */
	}
}